

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O0

void __thiscall
btAxisSweep3Internal<unsigned_short>::setAabb
          (btAxisSweep3Internal<unsigned_short> *this,btBroadphaseProxy *proxy,btVector3 *aabbMin,
          btVector3 *aabbMax,btDispatcher *dispatcher)

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  btDispatcher *in_RSI;
  btVector3 *in_RDI;
  undefined8 in_R8;
  btVector3 *unaff_retaddr;
  Handle *handle;
  
  *(undefined8 *)((long)&in_RSI[3]._vptr_btDispatcher + 4) = *in_RDX;
  *(undefined8 *)((long)&in_RSI[4]._vptr_btDispatcher + 4) = in_RDX[1];
  *(undefined8 *)((long)&in_RSI[5]._vptr_btDispatcher + 4) = *in_RCX;
  *(undefined8 *)((long)&in_RSI[6]._vptr_btDispatcher + 4) = in_RCX[1];
  updateHandle((btAxisSweep3Internal<unsigned_short> *)dispatcher,handle._6_2_,unaff_retaddr,in_RDI,
               in_RSI);
  if (*(long *)(in_RDI[9].m_floats + 2) != 0) {
    (**(code **)(**(long **)(in_RDI[9].m_floats + 2) + 0x20))
              (*(long **)(in_RDI[9].m_floats + 2),in_RSI[9]._vptr_btDispatcher,in_RDX,in_RCX,in_R8);
  }
  return;
}

Assistant:

void	btAxisSweep3Internal<BP_FP_INT_TYPE>::setAabb(btBroadphaseProxy* proxy,const btVector3& aabbMin,const btVector3& aabbMax,btDispatcher* dispatcher)
{
	Handle* handle = static_cast<Handle*>(proxy);
	handle->m_aabbMin = aabbMin;
	handle->m_aabbMax = aabbMax;
	updateHandle(static_cast<BP_FP_INT_TYPE>(handle->m_uniqueId), aabbMin, aabbMax,dispatcher);
	if (m_raycastAccelerator)
		m_raycastAccelerator->setAabb(handle->m_dbvtProxy,aabbMin,aabbMax,dispatcher);

}